

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_string.cpp
# Opt level: O1

dynamic_string * __thiscall
crnlib::dynamic_string::set_from_buf(dynamic_string *this,void *pBuf,uint buf_size)

{
  if (buf_size < 0xffff) {
    if (this->m_buf_size <= buf_size) {
      expand_buf(this,buf_size + 1,false);
    }
    if (buf_size < this->m_buf_size) {
      if (buf_size != 0) {
        memcpy(this->m_pStr,pBuf,(ulong)buf_size);
      }
      this->m_pStr[buf_size] = '\0';
      this->m_len = (uint16)buf_size;
    }
  }
  else {
    clear(this);
  }
  return this;
}

Assistant:

dynamic_string& dynamic_string::set_from_buf(const void* pBuf, uint buf_size) {
  CRNLIB_ASSERT(pBuf);

  if (buf_size >= cUINT16_MAX) {
    clear();
    return *this;
  }

#ifdef CRNLIB_BUILD_DEBUG
  if ((buf_size) && (memchr(pBuf, 0, buf_size) != NULL)) {
    CRNLIB_ASSERT(0);
    clear();
    return *this;
  }
#endif

  if (ensure_buf(buf_size, false)) {
    if (buf_size)
      memcpy(m_pStr, pBuf, buf_size);

    m_pStr[buf_size] = 0;

    m_len = static_cast<uint16>(buf_size);

    check();
  }

  return *this;
}